

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O0

vector<absl::string_view,_std::allocator<absl::string_view>_> *
absl::StrSplit<absl::string_view>
          (vector<absl::string_view,_std::allocator<absl::string_view>_> *__return_storage_ptr__,
          string_view *text,char delim,function<bool_(absl::string_view)> *predicate)

{
  string_view __args;
  string_view __args_00;
  bool bVar1;
  const_pointer pcVar2;
  size_type sVar3;
  undefined1 auStack_88 [8];
  string_view view;
  undefined1 auStack_50 [8];
  string_view view_1;
  size_type end;
  size_type begin;
  function<bool_(absl::string_view)> *predicate_local;
  char delim_local;
  string_view *text_local;
  vector<absl::string_view,_std::allocator<absl::string_view>_> *elems;
  
  std::vector<absl::string_view,_std::allocator<absl::string_view>_>::vector(__return_storage_ptr__)
  ;
  end = 0;
  while (view_1.length_ = string_view::find(text,delim,end), view_1.length_ != 0xffffffffffffffff) {
    pcVar2 = string_view::data(text);
    string_view::string_view((string_view *)auStack_50,pcVar2 + end,view_1.length_ - end);
    view.length_ = (size_type)auStack_50;
    __args_00.length_ = (size_type)view_1.ptr_;
    __args_00.ptr_ = (char *)auStack_50;
    bVar1 = std::function<bool_(absl::string_view)>::operator()(predicate,__args_00);
    if (bVar1) {
      std::vector<absl::string_view,std::allocator<absl::string_view>>::
      emplace_back<absl::string_view&>
                ((vector<absl::string_view,std::allocator<absl::string_view>> *)
                 __return_storage_ptr__,(string_view *)auStack_50);
    }
    end = view_1.length_ + 1;
  }
  pcVar2 = string_view::data(text);
  sVar3 = string_view::size(text);
  string_view::string_view((string_view *)auStack_88,pcVar2 + end,sVar3 - end);
  __args.length_ = (size_type)view.ptr_;
  __args.ptr_ = (char *)auStack_88;
  bVar1 = std::function<bool_(absl::string_view)>::operator()(predicate,__args);
  if (bVar1) {
    std::vector<absl::string_view,std::allocator<absl::string_view>>::
    emplace_back<absl::string_view&>
              ((vector<absl::string_view,std::allocator<absl::string_view>> *)__return_storage_ptr__
               ,(string_view *)auStack_88);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<String> StrSplit(String const& text, char const delim,
                        function<bool(string_view)> predicate) {
  vector<String> elems;
  typename String::size_type begin = 0;
  typename String::size_type end;
  while ((end = text.find(delim, begin)) != String::npos) {
    string_view view(text.data() + begin, end - begin);
    if (predicate(view))
      elems.emplace_back(view);
    begin = end + 1;
  }
  // Try to add the portion after the last delim.
  string_view view(text.data() + begin, text.size() - begin);
  if (predicate(view))
    elems.emplace_back(view);
  return elems;
}